

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_prep_setup(HalH264eVepuPrep *prep,MppEncPrepCfg *cfg)

{
  RK_U32 RVar1;
  int iVar2;
  MPP_RET MVar3;
  int iVar4;
  uint uVar5;
  VepuStrideCfg *stride_cfg;
  RK_S32 ver_stride;
  RK_S32 hor_stride;
  RK_U32 SWAP_tmp;
  RK_U32 rotation;
  RK_U32 height;
  RK_U32 width;
  VepuFormatCfg fmt_cfg;
  MppFrameFormat format;
  MPP_RET ret;
  MppEncPrepCfg *cfg_local;
  HalH264eVepuPrep *prep_local;
  
  fmt_cfg.swap_16_in = '\0';
  fmt_cfg.swap_32_in = '\0';
  fmt_cfg._10_2_ = 0;
  fmt_cfg._4_4_ = cfg->format;
  rotation = cfg->width;
  RVar1 = cfg->height;
  hor_stride = 0;
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_prep_setup");
  }
  if (cfg->mirroring != 0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","Warning: do not support mirroring\n","h264e_vepu_prep_setup");
  }
  if (cfg->rotation == MPP_ENC_ROT_90) {
    hor_stride = 1;
  }
  else if (cfg->rotation == MPP_ENC_ROT_270) {
    hor_stride = 2;
  }
  else if (cfg->rotation != MPP_ENC_ROT_0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2",
               "Warning: only support 90 or 270 degree rotate, request rotate %d",
               "h264e_vepu_prep_setup",0);
  }
  SWAP_tmp = RVar1;
  if (hor_stride != 0) {
    SWAP_tmp = rotation;
    rotation = RVar1;
  }
  prep->src_fmt = fmt_cfg._4_4_;
  prep->rotation = hor_stride;
  prep->src_w = rotation;
  prep->src_h = SWAP_tmp;
  MVar3 = get_vepu_fmt((VepuFormatCfg *)&height,fmt_cfg._4_4_);
  if (MVar3 == MPP_OK) {
    prep->r_mask_msb = (RK_U8)width;
    prep->g_mask_msb = width._1_1_;
    prep->b_mask_msb = width._2_1_;
    prep->swap_8_in = width._3_1_;
    prep->swap_16_in = (undefined1)fmt_cfg.format;
    prep->swap_32_in = fmt_cfg.format._1_1_;
    prep->src_fmt = height;
  }
  else {
    prep->src_fmt = 9;
  }
  if ((uint)fmt_cfg._4_4_ < 0x10000) {
    if (prep->src_fmt == 9) {
      _mpp_log_l(2,"hal_h264e_vepu_v2","vepu do not support input frame format %d\n",(char *)0x0,
                 (ulong)(uint)fmt_cfg._4_4_);
      fmt_cfg.swap_16_in = 0xff;
      fmt_cfg.swap_32_in = 0xff;
      fmt_cfg._10_2_ = 0xffff;
    }
    prep->color_conversion_coeff_a = 0;
    prep->color_conversion_coeff_b = 0;
    prep->color_conversion_coeff_c = 0;
    prep->color_conversion_coeff_e = 0;
    prep->color_conversion_coeff_f = 0;
  }
  else {
    if (prep->src_fmt == 9) {
      _mpp_log_l(2,"hal_h264e_vepu_v2","vepu do not support input frame format %d\n",(char *)0x0,
                 (ulong)(uint)fmt_cfg._4_4_);
      fmt_cfg.swap_16_in = 0xff;
      fmt_cfg.swap_32_in = 0xff;
      fmt_cfg._10_2_ = 0xffff;
    }
    if (cfg->color == MPP_FRAME_SPC_RGB) {
      prep->color_conversion_coeff_a = 0x4c85;
      prep->color_conversion_coeff_b = 0x962b;
      prep->color_conversion_coeff_c = 0x1d50;
      prep->color_conversion_coeff_e = 0x9090;
      prep->color_conversion_coeff_f = 0xb694;
    }
    else if (cfg->color == MPP_FRAME_SPC_BT709) {
      prep->color_conversion_coeff_a = 0x366d;
      prep->color_conversion_coeff_b = 0xb717;
      prep->color_conversion_coeff_c = 0x127c;
      prep->color_conversion_coeff_e = 0x89f5;
      prep->color_conversion_coeff_f = 0xa28f;
    }
    else {
      prep->color_conversion_coeff_a = 0x4c85;
      prep->color_conversion_coeff_b = 0x962b;
      prep->color_conversion_coeff_c = 0x1d50;
      prep->color_conversion_coeff_e = 0x9090;
      prep->color_conversion_coeff_f = 0xb694;
    }
  }
  RVar1 = cfg->hor_stride;
  iVar2 = cfg->ver_stride;
  prep->offset_cb = 0;
  prep->offset_cr = 0;
  get_vepu_pixel_stride(&prep->stride_cfg,prep->src_w,RVar1,fmt_cfg._4_4_);
  prep->pixel_stride = (prep->stride_cfg).pixel_stride;
  iVar4 = (prep->stride_cfg).pixel_stride * (prep->stride_cfg).pixel_size;
  uVar5 = fmt_cfg._4_4_ & 0xfffff;
  if (uVar5 == 0) {
    prep->offset_cb = iVar4 * iVar2;
    prep->size_y = (long)(int)(iVar4 * (prep->src_h + 0xfU & 0xfffffff0));
    prep->size_c = (long)(int)((iVar4 / 2) * (prep->src_h / 2 + 7U & 0xfffffff8));
  }
  else if (uVar5 == 4) {
    prep->offset_cb = iVar4 * iVar2;
    prep->offset_cr = prep->offset_cb + (iVar4 * iVar2) / 4;
    prep->size_y = (long)(int)(iVar4 * (prep->src_h + 0xfU & 0xfffffff0));
    prep->size_c = (long)(int)((iVar4 / 2) * (prep->src_h / 2 + 7U & 0xfffffff8));
  }
  else if ((uVar5 == 8) || (uVar5 == 10)) {
    prep->size_y = (long)(int)(iVar4 * (prep->src_h + 0xfU & 0xfffffff0));
    prep->size_c = 0;
  }
  else if (uVar5 - 0x10000 < 6) {
    prep->size_y = (long)(int)(iVar4 * (prep->src_h + 0xfU & 0xfffffff0));
    prep->size_c = 0;
  }
  else if (uVar5 - 0x10008 < 6) {
    prep->size_y = (long)(int)(iVar4 * (prep->src_h + 0xfU & 0xfffffff0));
    prep->size_c = 0;
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu_v2","invalid format %d","h264e_vepu_prep_setup",
               (ulong)(uint)fmt_cfg._4_4_);
    fmt_cfg.swap_16_in = 0xff;
    fmt_cfg.swap_32_in = 0xff;
    fmt_cfg._10_2_ = 0xffff;
  }
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_prep_setup");
  }
  MVar3._0_1_ = fmt_cfg.swap_16_in;
  MVar3._1_1_ = fmt_cfg.swap_32_in;
  MVar3._2_2_ = fmt_cfg._10_2_;
  return MVar3;
}

Assistant:

MPP_RET h264e_vepu_prep_setup(HalH264eVepuPrep *prep, MppEncPrepCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    MppFrameFormat format = cfg->format;
    VepuFormatCfg fmt_cfg;
    RK_U32 width = cfg->width;
    RK_U32 height = cfg->height;
    RK_U32 rotation = 0;

    hal_h264e_dbg_buffer("enter\n");

    // do not support mirroring
    if (cfg->mirroring)
        mpp_err_f("Warning: do not support mirroring\n");

    if (cfg->rotation == MPP_ENC_ROT_90)
        rotation = 1;
    else if (cfg->rotation == MPP_ENC_ROT_270)
        rotation = 2;
    else if (cfg->rotation != MPP_ENC_ROT_0)
        mpp_err_f("Warning: only support 90 or 270 degree rotate, request rotate %d", rotation);

    if (rotation)
        MPP_SWAP(RK_U32, width, height);

    prep->src_fmt = format;
    prep->rotation = rotation;
    prep->src_w = width;
    prep->src_h = height;

    if (!get_vepu_fmt(&fmt_cfg, format)) {
        prep->r_mask_msb = fmt_cfg.r_mask;
        prep->g_mask_msb = fmt_cfg.g_mask;
        prep->b_mask_msb = fmt_cfg.b_mask;
        prep->swap_8_in  = fmt_cfg.swap_8_in;
        prep->swap_16_in = fmt_cfg.swap_16_in;
        prep->swap_32_in = fmt_cfg.swap_32_in;
        prep->src_fmt    = fmt_cfg.format;
    } else {
        prep->src_fmt = VEPU_FMT_BUTT;
    }

    if (format < MPP_FRAME_FMT_RGB) {
        // YUV case
        if (prep->src_fmt == VEPU_FMT_BUTT) {
            mpp_err("vepu do not support input frame format %d\n", format);
            ret = MPP_NOK;
        }

        prep->color_conversion_coeff_a = 0;
        prep->color_conversion_coeff_b = 0;
        prep->color_conversion_coeff_c = 0;
        prep->color_conversion_coeff_e = 0;
        prep->color_conversion_coeff_f = 0;
    } else {

        if (prep->src_fmt == VEPU_FMT_BUTT) {
            mpp_err("vepu do not support input frame format %d\n", format);
            ret = MPP_NOK;
        }

        switch (cfg->color) {
        case MPP_FRAME_SPC_RGB : {
            /* BT.601 */
            /* Y  = 0.2989 R + 0.5866 G + 0.1145 B
             * Cb = 0.5647 (B - Y) + 128
             * Cr = 0.7132 (R - Y) + 128
             */
            prep->color_conversion_coeff_a = 19589;
            prep->color_conversion_coeff_b = 38443;
            prep->color_conversion_coeff_c = 7504;
            prep->color_conversion_coeff_e = 37008;
            prep->color_conversion_coeff_f = 46740;
        } break;
        case MPP_FRAME_SPC_BT709 : {
            /* BT.709 */
            /* Y  = 0.2126 R + 0.7152 G + 0.0722 B
             * Cb = 0.5389 (B - Y) + 128
             * Cr = 0.6350 (R - Y) + 128
             */
            prep->color_conversion_coeff_a = 13933;
            prep->color_conversion_coeff_b = 46871;
            prep->color_conversion_coeff_c = 4732;
            prep->color_conversion_coeff_e = 35317;
            prep->color_conversion_coeff_f = 41615;
        } break;
        default : {
            prep->color_conversion_coeff_a = 19589;
            prep->color_conversion_coeff_b = 38443;
            prep->color_conversion_coeff_c = 7504;
            prep->color_conversion_coeff_e = 37008;
            prep->color_conversion_coeff_f = 46740;
        } break;
        }
    }

    /* NOTE: vepu only support 8bit encoding and stride must match with width align to 16 */
    RK_S32 hor_stride = cfg->hor_stride;
    RK_S32 ver_stride = cfg->ver_stride;
    VepuStrideCfg *stride_cfg = &prep->stride_cfg;

    prep->offset_cb = 0;
    prep->offset_cr = 0;
    get_vepu_pixel_stride(stride_cfg, prep->src_w, hor_stride, format);
    prep->pixel_stride = stride_cfg->pixel_stride;
    hor_stride = stride_cfg->pixel_stride * stride_cfg->pixel_size;

    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        prep->offset_cb = hor_stride * ver_stride;
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = hor_stride / 2 * MPP_ALIGN(prep->src_h / 2, 8);
    } break;
    case MPP_FMT_YUV420P : {
        prep->offset_cb = hor_stride * ver_stride;
        prep->offset_cr = prep->offset_cb + ((hor_stride * ver_stride) / 4);
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = hor_stride / 2 * MPP_ALIGN(prep->src_h / 2, 8);
    } break;
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_UYVY : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_RGBA8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    default: {
        mpp_err_f("invalid format %d", format);
        ret = MPP_NOK;
    }
    }

    hal_h264e_dbg_buffer("leave\n");

    return ret;
}